

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options_descriptor.cpp
# Opt level: O1

string * __thiscall
program_options::option_description::format_name_abi_cxx11_
          (string *__return_storage_ptr__,option_description *this)

{
  size_type sVar1;
  pointer pcVar2;
  char *pcVar3;
  long *plVar4;
  long *local_40 [2];
  long local_30 [2];
  
  sVar1 = (this->m_short_name)._M_string_length;
  if (sVar1 == 0) {
    local_40[0] = local_30;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_40,"--","");
    plVar4 = (long *)std::__cxx11::string::_M_append
                               ((char *)local_40,
                                (ulong)(((this->m_long_names).
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                       _M_p);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,*plVar4,plVar4[1] + *plVar4);
    if (local_40[0] == local_30) {
      return __return_storage_ptr__;
    }
  }
  else {
    if ((this->m_long_names).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (this->m_long_names).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar2 = (this->m_short_name)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)__return_storage_ptr__,pcVar2,pcVar2 + sVar1);
      return __return_storage_ptr__;
    }
    pcVar2 = (this->m_short_name)._M_dataplus._M_p;
    local_40[0] = local_30;
    std::__cxx11::string::_M_construct<char*>((string *)local_40,pcVar2,pcVar2 + sVar1);
    pcVar3 = (char *)std::__cxx11::string::append((char *)local_40);
    pcVar3 = (char *)std::__cxx11::string::_M_append
                               (pcVar3,(ulong)(((this->m_long_names).
                                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start)->
                                              _M_dataplus)._M_p);
    plVar4 = (long *)std::__cxx11::string::append(pcVar3);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,*plVar4,plVar4[1] + *plVar4);
    if (local_40[0] == local_30) {
      return __return_storage_ptr__;
    }
  }
  operator_delete(local_40[0],local_30[0] + 1);
  return __return_storage_ptr__;
}

Assistant:

std::string option_description::format_name() const
{
    if (!m_short_name.empty())
    {
        if (m_long_names.empty()) {
            return m_short_name;
        } else {
            return std::string(m_short_name)
                    .append(" [ --")
                    .append(*m_long_names.begin())
                    .append(" ]");
        }
    }
    return std::string("--").append(*m_long_names.begin());
}